

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict type_spec(c2m_ctx_t c2m_ctx,int no_err_p,node_t_conflict arg)

{
  short sVar1;
  short sVar2;
  parse_ctx *ppVar3;
  token_t ptVar4;
  undefined8 uVar5;
  node_t_conflict pnVar6;
  node_t_conflict op2;
  char *pcVar7;
  node_code_t nVar8;
  int iVar9;
  code *pcVar10;
  parse_ctx_t parse_ctx;
  undefined8 unaff_R14;
  undefined8 uVar11;
  char *unaff_R15;
  pos_t p;
  node_t_conflict local_50;
  node_t_conflict local_40;
  node_t_conflict local_38;
  
  ppVar3 = c2m_ctx->parse_ctx;
  ptVar4 = ppVar3->curr_token;
  if (*(short *)ptVar4 == 0x13a) {
    pcVar7 = (ptVar4->pos).fname;
    uVar11._0_4_ = (ptVar4->pos).lno;
    uVar11._4_4_ = (ptVar4->pos).ln_pos;
    read_token(c2m_ctx);
    nVar8 = N_VOID;
  }
  else {
    ptVar4 = c2m_ctx->parse_ctx->curr_token;
    if (*(short *)ptVar4 == 0x11d) {
      pcVar7 = (ptVar4->pos).fname;
      uVar11._0_4_ = (ptVar4->pos).lno;
      uVar11._4_4_ = (ptVar4->pos).ln_pos;
      read_token(c2m_ctx);
      nVar8 = N_CHAR;
    }
    else {
      ptVar4 = c2m_ctx->parse_ctx->curr_token;
      if (*(short *)ptVar4 == 0x130) {
        pcVar7 = (ptVar4->pos).fname;
        uVar11._0_4_ = (ptVar4->pos).lno;
        uVar11._4_4_ = (ptVar4->pos).ln_pos;
        read_token(c2m_ctx);
        nVar8 = N_SHORT;
      }
      else {
        ptVar4 = c2m_ctx->parse_ctx->curr_token;
        if (*(short *)ptVar4 == 299) {
          pcVar7 = (ptVar4->pos).fname;
          uVar11._0_4_ = (ptVar4->pos).lno;
          uVar11._4_4_ = (ptVar4->pos).ln_pos;
          read_token(c2m_ctx);
          nVar8 = N_INT;
        }
        else {
          ptVar4 = c2m_ctx->parse_ctx->curr_token;
          if (*(short *)ptVar4 == 300) {
            pcVar7 = (ptVar4->pos).fname;
            uVar11._0_4_ = (ptVar4->pos).lno;
            uVar11._4_4_ = (ptVar4->pos).ln_pos;
            read_token(c2m_ctx);
            nVar8 = N_LONG;
          }
          else {
            ptVar4 = c2m_ctx->parse_ctx->curr_token;
            if (*(short *)ptVar4 == 0x126) {
              pcVar7 = (ptVar4->pos).fname;
              uVar11._0_4_ = (ptVar4->pos).lno;
              uVar11._4_4_ = (ptVar4->pos).ln_pos;
              read_token(c2m_ctx);
              nVar8 = N_FLOAT;
            }
            else {
              ptVar4 = c2m_ctx->parse_ctx->curr_token;
              if (*(short *)ptVar4 == 0x122) {
                pcVar7 = (ptVar4->pos).fname;
                uVar11._0_4_ = (ptVar4->pos).lno;
                uVar11._4_4_ = (ptVar4->pos).ln_pos;
                read_token(c2m_ctx);
                nVar8 = N_DOUBLE;
              }
              else {
                ptVar4 = c2m_ctx->parse_ctx->curr_token;
                if (*(short *)ptVar4 == 0x131) {
                  pcVar7 = (ptVar4->pos).fname;
                  uVar11._0_4_ = (ptVar4->pos).lno;
                  uVar11._4_4_ = (ptVar4->pos).ln_pos;
                  read_token(c2m_ctx);
                  nVar8 = N_SIGNED;
                }
                else {
                  ptVar4 = c2m_ctx->parse_ctx->curr_token;
                  if (*(short *)ptVar4 == 0x139) {
                    pcVar7 = (ptVar4->pos).fname;
                    uVar11._0_4_ = (ptVar4->pos).lno;
                    uVar11._4_4_ = (ptVar4->pos).ln_pos;
                    read_token(c2m_ctx);
                    nVar8 = N_UNSIGNED;
                  }
                  else {
                    ptVar4 = c2m_ctx->parse_ctx->curr_token;
                    if (*(short *)ptVar4 != 0x110) {
                      ptVar4 = c2m_ctx->parse_ctx->curr_token;
                      if (*(short *)ptVar4 == 0x111) {
                        pcVar7 = (ptVar4->pos).fname;
                        uVar5._0_4_ = (ptVar4->pos).lno;
                        uVar5._4_4_ = (ptVar4->pos).ln_pos;
                        read_token(c2m_ctx);
                        if (ppVar3->record_level != 0) {
                          return &err_struct;
                        }
                        error(c2m_ctx,0x1c3842,pcVar7,uVar5);
                        return &err_struct;
                      }
                      ptVar4 = c2m_ctx->parse_ctx->curr_token;
                      sVar1 = *(short *)ptVar4;
                      iVar9 = no_err_p;
                      if (sVar1 == 0x114) {
                        unaff_R15 = (ptVar4->pos).fname;
                        unaff_R14._0_4_ = (ptVar4->pos).lno;
                        unaff_R14._4_4_ = (ptVar4->pos).ln_pos;
                        read_token(c2m_ctx);
                      }
                      ptVar4 = c2m_ctx->parse_ctx->curr_token;
                      sVar2 = *(short *)ptVar4;
                      if (sVar1 == 0x114) {
                        if (sVar2 == 0x28) {
                          read_token(c2m_ctx);
                          pnVar6 = type_name(c2m_ctx,no_err_p);
                          if (pnVar6 == &err_struct) {
                            return &err_struct;
                          }
                          if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
                            read_token(c2m_ctx);
                            error(c2m_ctx,0x1c3864,unaff_R15,unaff_R14);
                            return pnVar6;
                          }
                          if (ppVar3->record_level != 0) {
                            return &err_struct;
                          }
                          iVar9 = 0x29;
                        }
                        else {
                          if (ppVar3->record_level != 0) {
                            return &err_struct;
                          }
                          iVar9 = 0x28;
                        }
                        goto LAB_0019a0de;
                      }
                      if (sVar2 == 0x134) {
                        pcVar7 = (ptVar4->pos).fname;
                        uVar11._0_4_ = (ptVar4->pos).lno;
                        uVar11._4_4_ = (ptVar4->pos).ln_pos;
                        read_token(c2m_ctx);
LAB_00199dd2:
                        ptVar4 = c2m_ctx->parse_ctx->curr_token;
                        sVar1 = *(short *)ptVar4;
                        if (sVar1 == 0x103) {
                          local_50 = ptVar4->node;
                          read_token(c2m_ctx);
                        }
                        else {
                          local_50 = new_node(c2m_ctx,N_IGNORE);
                        }
                        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x7b) {
                          read_token(c2m_ctx);
                          if (*(short *)ppVar3->curr_token == 0x7d) {
LAB_00199e57:
                            pcVar10 = error;
                            if (c2m_ctx->options->pedantic_p == 0) {
                              pcVar10 = warning;
                            }
                            (*pcVar10)(c2m_ctx,pcVar7,uVar11,"empty struct/union");
                            local_40 = new_node(c2m_ctx,N_LIST);
                          }
                          else {
                            if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
                              read_token(c2m_ctx);
                              goto LAB_00199e57;
                            }
                            local_40 = struct_declaration_list(c2m_ctx,no_err_p);
                            if (local_40 == &err_struct) {
                              return &err_struct;
                            }
                          }
                          if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x7d) {
LAB_0019a0b6:
                            if (ppVar3->record_level != 0) {
                              return &err_struct;
                            }
                            iVar9 = 0x7d;
LAB_0019a0de:
                            pcVar7 = get_token_name(c2m_ctx,iVar9);
LAB_0019a0e9:
                            syntax_error(c2m_ctx,pcVar7);
                            return &err_struct;
                          }
                          read_token(c2m_ctx);
                        }
                        else {
                          if (sVar1 != 0x103) {
LAB_0019a161:
                            return &err_struct;
                          }
                          local_40 = new_node(c2m_ctx,N_IGNORE);
                        }
                        nVar8 = sVar2 == 0x134 ^ N_UNION;
                      }
                      else {
                        ptVar4 = c2m_ctx->parse_ctx->curr_token;
                        if (*(short *)ptVar4 == 0x138) {
                          pcVar7 = (ptVar4->pos).fname;
                          uVar11._0_4_ = (ptVar4->pos).lno;
                          uVar11._4_4_ = (ptVar4->pos).ln_pos;
                          read_token(c2m_ctx);
                          goto LAB_00199dd2;
                        }
                        ptVar4 = c2m_ctx->parse_ctx->curr_token;
                        if (*(short *)ptVar4 != 0x124) {
                          if (arg == (node_t_conflict)0x0) {
                            pnVar6 = typedef_name(c2m_ctx,iVar9);
                            return pnVar6;
                          }
                          goto LAB_0019a161;
                        }
                        pcVar7 = (ptVar4->pos).fname;
                        uVar11._0_4_ = (ptVar4->pos).lno;
                        uVar11._4_4_ = (ptVar4->pos).ln_pos;
                        read_token(c2m_ctx);
                        ptVar4 = c2m_ctx->parse_ctx->curr_token;
                        sVar1 = *(short *)ptVar4;
                        if (sVar1 == 0x103) {
                          local_38 = ptVar4->node;
                          read_token(c2m_ctx);
                        }
                        else {
                          local_38 = new_node(c2m_ctx,N_IGNORE);
                        }
                        local_40 = new_node(c2m_ctx,N_LIST);
                        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x7b) {
                          read_token(c2m_ctx);
                          do {
                            ptVar4 = c2m_ctx->parse_ctx->curr_token;
                            if (*(short *)ptVar4 != 0x103) {
                              if (ppVar3->record_level != 0) {
                                return &err_struct;
                              }
                              pcVar7 = "identifier";
                              goto LAB_0019a0e9;
                            }
                            pnVar6 = ptVar4->node;
                            read_token(c2m_ctx);
                            if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3d) {
                              read_token(c2m_ctx);
                              op2 = cond_expr(c2m_ctx,no_err_p);
                              if (op2 == &err_struct) {
                                return &err_struct;
                              }
                            }
                            else {
                              op2 = new_node(c2m_ctx,N_IGNORE);
                            }
                            pnVar6 = new_node2(c2m_ctx,N_ENUM_CONST,pnVar6,op2);
                            op_append(c2m_ctx,local_40,pnVar6);
                          } while ((*(short *)c2m_ctx->parse_ctx->curr_token == 0x2c) &&
                                  (read_token(c2m_ctx), *(short *)ppVar3->curr_token != 0x7d));
                          if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x7d) {
                            read_token(c2m_ctx);
                            goto LAB_0019a14a;
                          }
                          goto LAB_0019a0b6;
                        }
                        if (sVar1 != 0x103) goto LAB_0019a161;
                        local_40 = new_node(c2m_ctx,N_IGNORE);
LAB_0019a14a:
                        nVar8 = N_ENUM;
                        local_50 = local_38;
                      }
                      pnVar6 = new_node2(c2m_ctx,nVar8,local_50,local_40);
                      goto LAB_00199c55;
                    }
                    pcVar7 = (ptVar4->pos).fname;
                    uVar11._0_4_ = (ptVar4->pos).lno;
                    uVar11._4_4_ = (ptVar4->pos).ln_pos;
                    read_token(c2m_ctx);
                    nVar8 = N_BOOL;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pnVar6 = new_node(c2m_ctx,nVar8);
LAB_00199c55:
  p.lno = (int)uVar11;
  p.ln_pos = (int)((ulong)uVar11 >> 0x20);
  p.fname = pcVar7;
  add_pos(c2m_ctx,pnVar6,p);
  return pnVar6;
}

Assistant:

DA (type_spec) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t op1, op2, op3, op4, r;
  int struct_p, id_p = FALSE;
  pos_t pos;

  if (MP (T_VOID, pos)) {
    r = new_pos_node (c2m_ctx, N_VOID, pos);
  } else if (MP (T_CHAR, pos)) {
    r = new_pos_node (c2m_ctx, N_CHAR, pos);
  } else if (MP (T_SHORT, pos)) {
    r = new_pos_node (c2m_ctx, N_SHORT, pos);
  } else if (MP (T_INT, pos)) {
    r = new_pos_node (c2m_ctx, N_INT, pos);
  } else if (MP (T_LONG, pos)) {
    r = new_pos_node (c2m_ctx, N_LONG, pos);
  } else if (MP (T_FLOAT, pos)) {
    r = new_pos_node (c2m_ctx, N_FLOAT, pos);
  } else if (MP (T_DOUBLE, pos)) {
    r = new_pos_node (c2m_ctx, N_DOUBLE, pos);
  } else if (MP (T_SIGNED, pos)) {
    r = new_pos_node (c2m_ctx, N_SIGNED, pos);
  } else if (MP (T_UNSIGNED, pos)) {
    r = new_pos_node (c2m_ctx, N_UNSIGNED, pos);
  } else if (MP (T_BOOL, pos)) {
    r = new_pos_node (c2m_ctx, N_BOOL, pos);
  } else if (MP (T_COMPLEX, pos)) {
    if (record_level == 0) error (c2m_ctx, pos, "complex numbers are not supported");
    return err_node;
  } else if (MP (T_ATOMIC, pos)) { /* atomic-type-specifier */
    PT ('(');
    P (type_name);
    PT (')');
    error (c2m_ctx, pos, "Atomic types are not supported");
  } else if ((struct_p = MP (T_STRUCT, pos)) || MP (T_UNION, pos)) {
    /* struct-or-union-specifier, struct-or-union */
    if (!MN (T_ID, op1)) {
      op1 = new_node (c2m_ctx, N_IGNORE);
    } else {
      id_p = TRUE;
    }
    if (M ('{')) {
      if (!C ('}') && !M (';')) {
        P (struct_declaration_list);
      } else {
        (c2m_options->pedantic_p ? error : warning) (c2m_ctx, pos, "empty struct/union");
        r = new_node (c2m_ctx, N_LIST);
      }
      PT ('}');
    } else if (!id_p) {
      return err_node;
    } else {
      r = new_node (c2m_ctx, N_IGNORE);
    }
    r = new_pos_node2 (c2m_ctx, struct_p ? N_STRUCT : N_UNION, pos, op1, r);
  } else if (MP (T_ENUM, pos)) { /* enum-specifier */
    if (!MN (T_ID, op1)) {
      op1 = new_node (c2m_ctx, N_IGNORE);
    } else {
      id_p = TRUE;
    }
    op2 = new_node (c2m_ctx, N_LIST);
    if (M ('{')) { /* enumerator-list */
      for (;;) {   /* enumerator */
        PTN (T_ID);
        op3 = r; /* enumeration-constant */
        if (!M ('=')) {
          op4 = new_node (c2m_ctx, N_IGNORE);
        } else {
          P (const_expr);
          op4 = r;
        }
        op_append (c2m_ctx, op2, new_node2 (c2m_ctx, N_ENUM_CONST, op3, op4));
        if (!M (',')) break;
        if (C ('}')) break;
      }
      PT ('}');
    } else if (!id_p) {
      return err_node;
    } else {
      op2 = new_node (c2m_ctx, N_IGNORE);
    }
    r = new_pos_node2 (c2m_ctx, N_ENUM, pos, op1, op2);
  } else if (arg == NULL) {
    P (typedef_name);
  } else {
    r = err_node;
  }
  return r;
}